

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::goToDirectory(QFileDialogPrivate *this,QString *path)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  QFileDialog *text;
  QAbstractItemModel *this_00;
  ulong uVar5;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *q;
  QString message;
  QDir dir;
  QString path2;
  QModelIndex index;
  undefined4 in_stack_fffffffffffffdf8;
  StandardButton in_stack_fffffffffffffdfc;
  QModelIndex *in_stack_fffffffffffffe00;
  undefined6 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  byte bVar6;
  undefined1 uVar7;
  QFileDialogPrivate *in_stack_fffffffffffffe10;
  QFlagsStorage<QMessageBox::StandardButton> buttons;
  QComboBox *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe34;
  byte bVar8;
  byte bVar9;
  QFileDialogPrivate *pQVar10;
  QChar fillChar;
  QChar local_1aa [25];
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_130;
  undefined1 local_128 [24];
  undefined1 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  QUrl local_f8 [7];
  undefined1 local_c0 [24];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = in_RDI;
  text = q_func(in_RDI);
  fillChar.ucs = (char16_t)((ulong)pQVar10 >> 0x30);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  this_00 = QComboBox::model(in_stack_fffffffffffffe20);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  iVar3 = QComboBox::currentIndex((QComboBox *)in_stack_fffffffffffffe00);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  iVar4 = QComboBox::modelColumn((QComboBox *)in_stack_fffffffffffffe00);
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  QComboBox::rootModelIndex((QComboBox *)in_stack_fffffffffffffe10);
  (**(code **)(*(long *)this_00 + 0x60))(&local_60,this_00,iVar3,iVar4,local_78);
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_fffffffffffffe00,
                   (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  bVar1 = QModelIndex::isValid(in_stack_fffffffffffffe00);
  if (bVar1) {
    QModelIndex::data((QModelIndex *)in_RDI,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    ::QVariant::toUrl();
    QUrl::toLocalFile();
    QString::operator=((QString *)in_stack_fffffffffffffe00,
                       (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QString::~QString((QString *)0x75ddcc);
    QUrl::~QUrl(local_f8);
    ::QVariant::~QVariant(&local_28);
    QFileSystemModel::index((QString *)local_128,(int)in_RDI->model);
    mapFromSource(in_stack_fffffffffffffe10,
                  (QModelIndex *)
                  CONCAT17(in_stack_fffffffffffffe0f,
                           CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)));
    local_60 = local_110;
    local_58 = (undefined1 *)local_108;
    local_50 = (undefined1 *)local_100;
  }
  else {
    in_stack_fffffffffffffe10 = (QFileDialogPrivate *)in_RDI->model;
    getEnvironmentVariable
              (in_stack_fffffffffffffe10,
               (QString *)
               CONCAT17(in_stack_fffffffffffffe0f,
                        CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)));
    QFileSystemModel::index((QString *)local_c0,(int)in_stack_fffffffffffffe10);
    mapFromSource(in_stack_fffffffffffffe10,
                  (QModelIndex *)
                  CONCAT17(in_stack_fffffffffffffe0f,
                           CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)));
    local_60 = local_a8;
    local_58 = (undefined1 *)local_a0;
    local_50 = (undefined1 *)local_98;
    QString::~QString((QString *)0x75dd61);
  }
  local_130 = &DAT_aaaaaaaaaaaaaaaa;
  QDir::QDir((QDir *)&local_130,(QString *)&local_90);
  uVar5 = QDir::exists();
  if ((uVar5 & 1) == 0) {
    getEnvironmentVariable
              (in_stack_fffffffffffffe10,
               (QString *)
               CONCAT17(in_stack_fffffffffffffe0f,
                        CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)));
    QDir::setPath((QString *)&local_130);
    QString::~QString((QString *)0x75dec4);
  }
  bVar2 = QDir::exists();
  bVar9 = 0;
  bVar8 = 0;
  bVar6 = true;
  if ((bVar2 & 1) == 0) {
    bVar1 = QString::isEmpty((QString *)0x75def5);
    bVar6 = true;
    if (!bVar1) {
      QFileSystemModel::myComputer((int)&local_48);
      bVar9 = 1;
      ::QVariant::toString();
      bVar8 = 1;
      bVar6 = ::operator==((QString *)in_stack_fffffffffffffe00,
                           (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8))
      ;
    }
  }
  uVar7 = bVar6;
  if ((bVar8 & 1) != 0) {
    QString::~QString((QString *)0x75df73);
  }
  if ((bVar9 & 1) != 0) {
    ::QVariant::~QVariant(&local_48);
  }
  if ((bVar6 & 1) == 0) {
    local_178 = &DAT_aaaaaaaaaaaaaaaa;
    local_170 = &DAT_aaaaaaaaaaaaaaaa;
    local_168 = &DAT_aaaaaaaaaaaaaaaa;
    QFileDialog::tr((char *)CONCAT17(uVar7,CONCAT16(bVar6,in_stack_fffffffffffffe08)),
                    (char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    QWidget::windowTitle((QWidget *)CONCAT17(uVar7,CONCAT16(bVar6,in_stack_fffffffffffffe08)));
    QChar::QChar<char16_t,_true>(local_1aa,L' ');
    QString::arg<QString,_true>
              ((QString *)this_00,(QString *)in_RDI,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
               fillChar);
    buttons.i = (Int)((ulong)in_RDI >> 0x20);
    QFlags<QMessageBox::StandardButton>::QFlags
              ((QFlags<QMessageBox::StandardButton> *)text,in_stack_fffffffffffffdfc);
    QMessageBox::warning
              ((QWidget *)in_stack_fffffffffffffe10,
               (QString *)CONCAT17(uVar7,CONCAT16(bVar6,in_stack_fffffffffffffe08)),(QString *)text,
               (StandardButtons)buttons.i,in_stack_fffffffffffffdfc);
    QString::~QString((QString *)0x75e072);
    QString::~QString((QString *)0x75e07c);
    QString::~QString((QString *)0x75e089);
  }
  else {
    enterDirectory((QFileDialogPrivate *)
                   CONCAT17(bVar9,CONCAT16(bVar8,CONCAT24(in_stack_fffffffffffffe34,iVar4))),
                   (QModelIndex *)CONCAT44(iVar3,in_stack_fffffffffffffe28));
  }
  QDir::~QDir((QDir *)&local_130);
  QString::~QString((QString *)0x75e0a3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::goToDirectory(const QString &path)
{
    enum { UrlRole = Qt::UserRole + 1 };

 #if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
#endif
    QModelIndex index = qFileDialogUi->lookInCombo->model()->index(qFileDialogUi->lookInCombo->currentIndex(),
                                                    qFileDialogUi->lookInCombo->modelColumn(),
                                                    qFileDialogUi->lookInCombo->rootModelIndex());
    QString path2 = path;
    if (!index.isValid())
        index = mapFromSource(model->index(getEnvironmentVariable(path)));
    else {
        path2 = index.data(UrlRole).toUrl().toLocalFile();
        index = mapFromSource(model->index(path2));
    }
    QDir dir(path2);
    if (!dir.exists())
        dir.setPath(getEnvironmentVariable(path2));

    if (dir.exists() || path2.isEmpty() || path2 == model->myComputer().toString()) {
        enterDirectory(index);
#if QT_CONFIG(messagebox)
    } else {
        QString message = QFileDialog::tr("%1\nDirectory not found.\nPlease verify the "
                                          "correct directory name was given.");
        QMessageBox::warning(q, q->windowTitle(), message.arg(path2));
#endif // QT_CONFIG(messagebox)
    }
}